

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O2

void * base_alloc_impl(tsdn_t *tsdn,base_t *base,size_t size,size_t alignment,size_t *esn)

{
  extent_hooks_t *extent_hooks;
  uint uVar1;
  extent_t *extent;
  base_block_t *pbVar2;
  void *addr;
  extent_heap_t *ph;
  ulong alignment_00;
  ulong uVar3;
  ulong size_00;
  size_t gap_size;
  
  alignment_00 = alignment + 0xf & 0xfffffffffffffff0;
  size_00 = -alignment_00 & (size + alignment_00) - 1;
  uVar3 = (size_00 + alignment_00) - 0x10;
  malloc_mutex_lock(tsdn,&base->mtx);
  if (uVar3 < 0x1001) {
    uVar1 = (uint)sz_size2index_tab[(size_00 + alignment_00) - 9 >> 3];
  }
  else {
    uVar1 = sz_size2index_compute(uVar3);
  }
  uVar3 = (ulong)uVar1 - 1;
  ph = base->avail + uVar1;
  do {
    uVar3 = uVar3 + 1;
    if (0xe7 < uVar3) {
      extent_hooks = (extent_hooks_t *)(base->extent_hooks).repr;
      (base->mtx).field_0.field_0.locked.repr = false;
      pthread_mutex_unlock((pthread_mutex_t *)((long)&(base->mtx).field_0 + 0x40));
      pbVar2 = base_block_alloc(tsdn,base,extent_hooks,base->ind,&base->pind_last,
                                &base->extent_sn_next,size_00,alignment_00);
      malloc_mutex_lock(tsdn,&base->mtx);
      if (pbVar2 == (base_block_t *)0x0) {
        addr = (void *)0x0;
        goto LAB_0011446c;
      }
      pbVar2->next = base->blocks;
      base->blocks = pbVar2;
      base->allocated = base->allocated + 0x90;
      base->resident = base->resident + 0x1000;
      base->mapped = base->mapped + pbVar2->size;
      if (((opt_metadata_thp != metadata_thp_disabled) && (init_system_thp_mode == thp_mode_default)
          ) && ((opt_metadata_thp != metadata_thp_auto || (base->auto_thp_switched == true)))) {
        base->n_thp = base->n_thp + 1;
      }
      extent = &pbVar2->extent;
      break;
    }
    extent = extent_heap_remove_first(ph);
    ph = ph + 1;
  } while (extent == (extent_t *)0x0);
  addr = base_extent_bump_alloc_helper(extent,&gap_size,size_00,alignment_00);
  base_extent_bump_alloc_post(base,extent,gap_size,addr,size_00);
  if (esn != (size_t *)0x0) {
    *esn = extent->e_bits >> 0x2a;
  }
LAB_0011446c:
  (base->mtx).field_0.field_0.locked.repr = false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&(base->mtx).field_0 + 0x40));
  return addr;
}

Assistant:

static void *
base_alloc_impl(tsdn_t *tsdn, base_t *base, size_t size, size_t alignment,
    size_t *esn) {
	alignment = QUANTUM_CEILING(alignment);
	size_t usize = ALIGNMENT_CEILING(size, alignment);
	size_t asize = usize + alignment - QUANTUM;

	extent_t *extent = NULL;
	malloc_mutex_lock(tsdn, &base->mtx);
	for (szind_t i = sz_size2index(asize); i < SC_NSIZES; i++) {
		extent = extent_heap_remove_first(&base->avail[i]);
		if (extent != NULL) {
			/* Use existing space. */
			break;
		}
	}
	if (extent == NULL) {
		/* Try to allocate more space. */
		extent = base_extent_alloc(tsdn, base, usize, alignment);
	}
	void *ret;
	if (extent == NULL) {
		ret = NULL;
		goto label_return;
	}

	ret = base_extent_bump_alloc(base, extent, usize, alignment);
	if (esn != NULL) {
		*esn = extent_sn_get(extent);
	}
label_return:
	malloc_mutex_unlock(tsdn, &base->mtx);
	return ret;
}